

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.h
# Opt level: O2

int __thiscall GrcManager::TableVersion(GrcManager *this,int ti)

{
  int iVar1;
  
  iVar1 = 0;
  switch(ti) {
  case 0x12:
    return this->m_fxdFeatTableVersion;
  case 0x13:
    return this->m_fxdGlatTableVersion;
  case 0x14:
    return this->m_fxdGlocTableVersion;
  case 0x15:
    return this->m_fxdSilfTableVersion;
  case 0x17:
    iVar1 = this->m_fxdSillTableVersion;
  }
  return iVar1;
}

Assistant:

int TableVersion(int ti)
	{
		switch (ti)
		{
		case ktiSilf:	return m_fxdSilfTableVersion;
		case ktiGloc:	return m_fxdGlocTableVersion;
		case ktiGlat:	return m_fxdGlatTableVersion;
		case ktiFeat:	return m_fxdFeatTableVersion;
		case ktiSill:	return m_fxdSillTableVersion;
		default:		return 0;
		}
	}